

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

string * dtc::anon_unknown_3::dirbasename
                   (string *__return_storage_ptr__,function<char_*(char_*)> *fn,string *s)

{
  __type _Var1;
  char *pcVar2;
  pointer __args;
  allocator<char> local_6d [20];
  undefined1 local_59;
  _func_void_void_ptr *local_58;
  undefined1 local_50 [8];
  unique_ptr<char,_void_(*)(void_*)_noexcept> str;
  string *s_local;
  function<char_*(char_*)> *fn_local;
  string *dn;
  
  std::__cxx11::string::string
            ((string *)
             &str._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)_noexcept>._M_t.
              super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)_noexcept>.
              super__Head_base<0UL,_char_*,_false>);
  _Var1 = std::operator==(s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &str._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)_noexcept>._M_t.
                             super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)_noexcept>.
                             super__Head_base<0UL,_char_*,_false>);
  std::__cxx11::string::~string
            ((string *)
             &str._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)_noexcept>._M_t.
              super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)_noexcept>.
              super__Head_base<0UL,_char_*,_false>);
  if (_Var1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strdup(pcVar2);
    local_58 = free;
    std::unique_ptr<char,void(*)(void*)noexcept>::unique_ptr<void(*)(void*)noexcept,void>
              ((unique_ptr<char,void(*)(void*)noexcept> *)local_50,pcVar2,&local_58);
    local_59 = 0;
    __args = std::unique_ptr<char,_void_(*)(void_*)_noexcept>::get
                       ((unique_ptr<char,_void_(*)(void_*)_noexcept> *)local_50);
    pcVar2 = std::function<char_*(char_*)>::operator()(fn,__args);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,local_6d);
    std::allocator<char>::~allocator(local_6d);
    local_59 = 1;
    std::unique_ptr<char,_void_(*)(void_*)_noexcept>::~unique_ptr
              ((unique_ptr<char,_void_(*)(void_*)_noexcept> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string
dirbasename(std::function<char*(char*)> fn, const string &s)
{
	if (s == string())
	{
		return string();
	}
	std::unique_ptr<char, decltype(free)*> str = {strdup(s.c_str()), free};
	string dn(fn(str.get()));
	return dn;
}